

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O1

void __thiscall
phpconvert::ZendParser::processFileProcedural
          (ZendParser *this,File *file,string *tmpString,string *tmpClassNameLower,
          PreparedType *preparedType,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tmpVector,stringstream *stream)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  PreparedType *pPVar3;
  stringstream *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type;
  iterator iVar5;
  long *plVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__value;
  long lVar9;
  string alias;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  PreparedType *local_d0;
  string *local_c8;
  stringstream *local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90;
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_b8 = tmpVector;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&this->builtInTypes->_M_t,&preparedType->type);
  type = local_b8;
  if ((_Rb_tree_header *)iVar5._M_node == &(this->builtInTypes->_M_t)._M_impl.super__Rb_tree_header)
  {
    local_c0 = stream;
    local_c8 = tmpString;
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&file->mainTypes->_M_t,&preparedType->type);
    if ((_Rb_tree_header *)iVar5._M_node != &(file->mainTypes->_M_t)._M_impl.super__Rb_tree_header)
    {
      std::__cxx11::string::_M_assign((string *)&preparedType->alias);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this->builtInTypes,&preparedType->type);
      return;
    }
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&this->keywords->_M_t,tmpClassNameLower);
    if ((_Rb_tree_header *)iVar5._M_node == &(this->keywords->_M_t)._M_impl.super__Rb_tree_header) {
      psVar1 = &preparedType->alias;
      generateNamespace(this,&preparedType->type,psVar1);
      std::operator+(&local_f0,"\\",psVar1);
      std::__cxx11::string::operator=((string *)psVar1,(string *)&local_f0);
    }
    else {
      local_d0 = preparedType;
      generateAlias(&local_f0,(ZendParser *)tmpClassNameLower,type,2);
      psVar4 = local_c0;
      local_110._M_string_length = 0;
      local_110.field_2._M_allocated_capacity =
           local_110.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::stringbuf::str((string *)(local_c0 + 0x18));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      std::ios::clear((int)*(undefined8 *)(*(long *)psVar4 + -0x18) + (int)psVar4);
      __value = (type->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_110._M_dataplus._M_p = (pointer)(psVar4 + 0x10);
      local_110._M_string_length = 0x1311a2;
      lVar9 = (long)(type->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish + (-0x20 - (long)__value) >> 5;
      if (0 < lVar9) {
        lVar9 = lVar9 + 1;
        do {
          std::
          ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
          ::operator=((ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
                       *)&local_110,__value);
          __value = __value + 1;
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      paVar2 = &local_110.field_2;
      std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_a0 = *plVar7;
        lStack_98 = plVar6[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar7;
        local_b0 = (long *)*plVar6;
      }
      local_a8 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_b0,(ulong)local_f0._M_dataplus._M_p);
      psVar1 = local_c8;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar8) {
        local_110.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_110.field_2._8_8_ = plVar6[3];
        local_110._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_110.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_110._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_110._M_string_length = plVar6[1];
      *plVar6 = (long)paVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      generateNamespace(this,&local_110,local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0);
      }
      pPVar3 = local_d0;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      std::operator+(&local_110,"\\",psVar1);
      std::__cxx11::string::operator=((string *)&pPVar3->alias,(string *)&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
    }
  }
  else {
    std::operator+(&local_f0,"\\\\",&preparedType->type);
    std::__cxx11::string::operator=((string *)&preparedType->alias,(string *)&local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void
    ZendParser::processFileProcedural(const BaseParser::File &file, string &tmpString, const string &tmpClassNameLower,
                                      BaseParser::PreparedType &preparedType, vector<string> &tmpVector,
                                      stringstream &stream) {
        if (isBuiltInType(preparedType)) {
            preparedType.alias = "\\\\" + preparedType.type;
        } else if (isInMainTypes(file, preparedType)) {
            preparedType.alias = preparedType.type;
            builtInTypes->insert(preparedType.type);
        } else if (isKeyword(tmpClassNameLower)) {
            string alias = generateAlias(tmpVector, 2);
            stream.str(string());
            stream.clear();
            copy(tmpVector.begin(), tmpVector.end() - 1,
                 ostream_iterator<string>(stream, DELIMETER));

            generateNamespace(
                    stream.str().substr(0, stream.str().length() - 1) + DELIMETER
                    + alias, tmpString);

            preparedType.alias = NAMESPACE_SEPARATOR + tmpString;
//				    cout <<"isKeyword alias: "<<preparedType.alias<<"\n";
        } else {
//                    cout <<"standard type alias: \n";
            generateNamespace(preparedType.type, preparedType.alias);
            preparedType.alias = NAMESPACE_SEPARATOR + preparedType.alias;
//				    cout <<preparedType.alias<<"\n";
        }
    }